

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O2

void __thiscall ControlParser::parseLinkSetting(ControlParser *this,Network *network)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  InputError *pIVar3;
  char *__to;
  string local_e8;
  string local_c8;
  string local_a8;
  size_type *local_88;
  string id;
  undefined1 local_48 [8];
  string settingStr;
  
  local_88 = &id._M_string_length;
  id._M_dataplus._M_p = (pointer)0x0;
  id._M_string_length._0_1_ = 0;
  std::operator>>((istream *)this,(string *)&local_88);
  iVar2 = Network::link(network,(char *)&local_88,__to);
  this->link = (Link *)CONCAT44(extraout_var,iVar2);
  if ((Link *)CONCAT44(extraout_var,iVar2) == (Link *)0x0) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_e8,(string *)&local_88);
    InputError::InputError(pIVar3,5,&local_e8);
    __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
  }
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) != 0) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_c8,"",(allocator *)local_48);
    InputError::InputError(pIVar3,2,&local_c8);
    __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
  }
  local_48 = (undefined1  [8])&settingStr._M_string_length;
  settingStr._M_dataplus._M_p = (pointer)0x0;
  settingStr._M_string_length._0_1_ = 0;
  std::operator>>((istream *)this,(string *)local_48);
  std::__cxx11::string::string
            ((string *)(id.field_2._M_local_buf + 8),"OPEN",
             (allocator *)(settingStr.field_2._M_local_buf + 0xf));
  bVar1 = Utilities::match((string *)local_48,(string *)((long)&id.field_2 + 8));
  std::__cxx11::string::~string((string *)(id.field_2._M_local_buf + 8));
  if (bVar1) {
    iVar2 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)(id.field_2._M_local_buf + 8),"CLOSED",
               (allocator *)(settingStr.field_2._M_local_buf + 0xf));
    bVar1 = Utilities::match((string *)local_48,(string *)((long)&id.field_2 + 8));
    std::__cxx11::string::~string((string *)(id.field_2._M_local_buf + 8));
    iVar2 = 0;
    if (!bVar1) {
      bVar1 = Utilities::parseNumber<double>((string *)local_48,&this->linkSetting);
      if (!bVar1) {
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_a8,(string *)local_48);
        InputError::InputError(pIVar3,6,&local_a8);
        __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
      }
      goto LAB_00130117;
    }
  }
  this->linkStatus = iVar2;
LAB_00130117:
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void ControlParser::parseLinkSetting(Network* network)
{
    //... read id of link being controlled
    string id;
    sin >> id;
    link = network->link(id);
    if (link == nullptr) throw InputError(InputError::UNDEFINED_OBJECT, id);

    //... read control setting/status as a string
    if ( sin.eof() ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string settingStr;
    sin >> settingStr;

    //... convert string to status or to numerical value
    if ( Utilities::match(settingStr, w_OPEN) )
    {
        linkStatus = Control::OPEN_STATUS;
    }
    else if ( Utilities::match(settingStr, w_CLOSED) )
    {
        linkStatus = Control::CLOSED_STATUS;
    }
    else if ( !Utilities::parseNumber(settingStr, linkSetting) )
    {
        throw InputError(InputError::INVALID_NUMBER, settingStr);
    }
}